

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void __thiscall
lodepng::ExtractZlib::getTreeInflateDynamic
          (ExtractZlib *this,HuffmanTree *tree,HuffmanTree *treeD,uchar *in,size_t *bp,
          size_t inlength)

{
  size_t sVar1;
  uchar *bits;
  int iVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  long lVar6;
  pointer puVar7;
  unsigned_long *puVar8;
  pointer puVar9;
  size_t i;
  ulong uVar10;
  pointer puVar11;
  unsigned_long *puVar12;
  unsigned_long *puVar13;
  size_t i_1;
  long *plVar14;
  ulong uVar15;
  size_t j;
  long lVar16;
  bool bVar17;
  int local_c4;
  ulong local_c0;
  uchar *local_b8;
  ulong local_b0;
  long local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlenD;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bitlen;
  vector<unsigned_long,_std::allocator<unsigned_long>_> codelengthcode;
  
  sVar1 = *bp;
  bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8 = in;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bitlen,0x120,(value_type_conflict2 *)&bitlenD,(allocator_type *)&codelengthcode);
  codelengthcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bitlenD,0x20,(value_type_conflict2 *)&codelengthcode,(allocator_type *)&local_c4);
  bits = local_b8;
  if (inlength - 2 <= *bp >> 3) {
    this->error = 0x31;
    goto LAB_0011d60a;
  }
  uVar3 = readBitsFromStream(this,bp,local_b8,5);
  uVar4 = readBitsFromStream(this,bp,bits,5);
  uVar5 = readBitsFromStream(this,bp,bits,4);
  lVar16 = *(long *)(this->zlibinfo + 8);
  *(int *)(lVar16 + -0x110) = (int)uVar3;
  *(int *)(lVar16 + -0x10c) = (int)uVar4;
  *(int *)(lVar16 + -0x108) = (int)uVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&codelengthcode,0x13,(allocator_type *)&local_c4);
  local_c0 = uVar3 + 0x101;
  local_b0 = uVar4 + 1;
  plVar14 = &CLCL;
  for (uVar10 = 0; uVar10 != 0x13; uVar10 = uVar10 + 1) {
    if (uVar10 < uVar5 + 4) {
      uVar4 = readBitsFromStream(this,bp,local_b8,3);
    }
    else {
      uVar4 = 0;
    }
    codelengthcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[*plVar14] = uVar4;
    plVar14 = plVar14 + 1;
  }
  for (uVar10 = 0;
      uVar10 < (ulong)((long)codelengthcode.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)codelengthcode.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1) {
    local_c4 = (int)codelengthcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10];
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0x100),
               &local_c4);
  }
  iVar2 = HuffmanTree::makeFromLengths(&this->codelengthcodetree,&codelengthcode,7);
  this->error = iVar2;
  if (iVar2 == 0) {
    local_b0 = local_b0 + local_c0;
    local_a8 = uVar3 * -8 + -0x808;
    uVar10 = 0;
LAB_0011d37b:
    do {
      uVar15 = uVar10;
      if (local_b0 <= uVar15) goto LAB_0011d630;
      uVar4 = huffmanDecodeSymbol(this,local_b8,bp,&this->codelengthcodetree,inlength);
      if (this->error != 0) break;
      local_c4 = (int)uVar4;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xe8),
                 &local_c4);
      if (uVar4 < 0x10) {
        puVar8 = bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar15;
        if (local_c0 <= uVar15) {
          puVar8 = bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start + (uVar15 - local_c0);
        }
        *puVar8 = uVar4;
        uVar10 = uVar15 + 1;
        goto LAB_0011d37b;
      }
      if (uVar4 != 0x12) {
        if (uVar4 == 0x11) {
          if (*bp >> 3 < inlength) {
            uVar4 = readBitsFromStream(this,bp,local_b8,3);
            lVar16 = uVar4 + 3;
            local_c4 = (int)lVar16;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xe8),
                       &local_c4);
            puVar7 = bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar15;
            uVar10 = lVar16 + uVar15;
            puVar9 = (pointer)((long)bitlenD.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              uVar15 * 8 + local_a8);
            while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
              if (local_b0 <= uVar15) {
                iVar2 = 0xe;
                goto LAB_0011d5fc;
              }
              puVar11 = puVar9;
              if (uVar15 < local_c0) {
                puVar11 = puVar7;
              }
              *puVar11 = 0;
              uVar15 = uVar15 + 1;
              puVar7 = puVar7 + 1;
              puVar9 = puVar9 + 1;
            }
            goto LAB_0011d37b;
          }
        }
        else {
          if (uVar4 != 0x10) {
            iVar2 = 0x10;
            goto LAB_0011d5fc;
          }
          if (*bp >> 3 < inlength) {
            uVar4 = readBitsFromStream(this,bp,local_b8,2);
            puVar9 = bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + (uVar15 - uVar3) + -0x102;
            if (uVar15 - 1 < local_c0) {
              puVar9 = bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + (uVar15 - 1);
            }
            uVar5 = *puVar9;
            lVar16 = uVar4 + uVar15;
            lVar6 = uVar4 + 3;
            puVar8 = bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar15;
            puVar12 = (unsigned_long *)
                      ((long)bitlenD.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar15 * 8 + local_a8);
            while (bVar17 = lVar6 != 0, lVar6 = lVar6 + -1, uVar10 = lVar16 + 3, bVar17) {
              if (local_b0 <= uVar15) {
                iVar2 = 0xd;
                goto LAB_0011d5fc;
              }
              puVar13 = puVar12;
              if (uVar15 < local_c0) {
                puVar13 = puVar8;
              }
              *puVar13 = uVar5;
              uVar15 = uVar15 + 1;
              puVar8 = puVar8 + 1;
              puVar12 = puVar12 + 1;
            }
            goto LAB_0011d37b;
          }
        }
LAB_0011d6d5:
        iVar2 = 0x32;
        goto LAB_0011d5fc;
      }
      if (inlength <= *bp >> 3) goto LAB_0011d6d5;
      uVar4 = readBitsFromStream(this,bp,local_b8,7);
      lVar16 = uVar4 + 0xb;
      local_c4 = (int)lVar16;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xe8),
                 &local_c4);
      puVar7 = bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar15;
      uVar10 = lVar16 + uVar15;
      puVar9 = (pointer)((long)bitlenD.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar15 * 8 + local_a8);
      while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
        if (local_b0 <= uVar15) {
          iVar2 = 0xf;
          goto LAB_0011d5fc;
        }
        puVar11 = puVar9;
        if (uVar15 < local_c0) {
          puVar11 = puVar7;
        }
        *puVar11 = 0;
        uVar15 = uVar15 + 1;
        puVar7 = puVar7 + 1;
        puVar9 = puVar9 + 1;
      }
    } while( true );
  }
  goto LAB_0011d600;
LAB_0011d630:
  if (bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[0x100] == 0) {
    iVar2 = 0x40;
LAB_0011d5fc:
    this->error = iVar2;
  }
  else {
    iVar2 = HuffmanTree::makeFromLengths(tree,&bitlen,0xf);
    this->error = iVar2;
    if (iVar2 == 0) {
      iVar2 = HuffmanTree::makeFromLengths(treeD,&bitlenD,0xf);
      this->error = iVar2;
      if (iVar2 == 0) {
        *(size_t *)(*(long *)(this->zlibinfo + 8) + -0x118) = *bp - sVar1;
        for (uVar10 = 0;
            uVar10 < (ulong)((long)bitlen.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)bitlen.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar10 = uVar10 + 1) {
          local_c4 = (int)bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10];
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xd0),
                     &local_c4);
        }
        for (uVar10 = 0;
            uVar10 < (ulong)((long)bitlenD.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)bitlenD.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar10 = uVar10 + 1) {
          local_c4 = (int)bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10];
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)(*(long *)(this->zlibinfo + 8) + -0xb8),
                     &local_c4);
        }
      }
    }
  }
LAB_0011d600:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&codelengthcode.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_0011d60a:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bitlenD.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bitlen.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void getTreeInflateDynamic(HuffmanTree& tree, HuffmanTree& treeD,
                             const unsigned char* in, size_t& bp, size_t inlength) {
    size_t bpstart = bp;
    //get the tree of a deflated block with dynamic tree, the tree itself is also Huffman compressed with a known tree
    std::vector<unsigned long> bitlen(288, 0), bitlenD(32, 0);
    if(bp >> 3 >= inlength - 2) { error = 49; return; } //the bit pointer is or will go past the memory
    size_t HLIT =  readBitsFromStream(bp, in, 5) + 257; //number of literal/length codes + 257
    size_t HDIST = readBitsFromStream(bp, in, 5) + 1; //number of dist codes + 1
    size_t HCLEN = readBitsFromStream(bp, in, 4) + 4; //number of code length codes + 4
    zlibinfo->back().hlit = HLIT - 257;
    zlibinfo->back().hdist = HDIST - 1;
    zlibinfo->back().hclen = HCLEN - 4;
    std::vector<unsigned long> codelengthcode(19); //lengths of tree to decode the lengths of the dynamic tree
    for(size_t i = 0; i < 19; i++) codelengthcode[CLCL[i]] = (i < HCLEN) ? readBitsFromStream(bp, in, 3) : 0;
    //code length code lengths
    for(size_t i = 0; i < codelengthcode.size(); i++) zlibinfo->back().clcl.push_back(codelengthcode[i]);
    error = codelengthcodetree.makeFromLengths(codelengthcode, 7); if(error) return;
    size_t i = 0, replength;
    while(i < HLIT + HDIST) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codelengthcodetree, inlength); if(error) return;
      zlibinfo->back().treecodes.push_back(code); //tree symbol code
      if(code <= 15)  { if(i < HLIT) bitlen[i++] = code; else bitlenD[i++ - HLIT] = code; } //a length code
      else if(code == 16) { //repeat previous
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 2);
        unsigned long value; //set value to the previous code
        if((i - 1) < HLIT) value = bitlen[i - 1];
        else value = bitlenD[i - HLIT - 1];
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 13; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = value; else bitlenD[i++ - HLIT] = value;
        }
      } else if(code == 17) { //repeat "0" 3-10 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 3 + readBitsFromStream(bp, in, 3);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 14; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      } else if(code == 18) { //repeat "0" 11-138 times
        if(bp >> 3 >= inlength) { error = 50; return; } //error, bit pointer jumps past memory
        replength = 11 + readBitsFromStream(bp, in, 7);
        zlibinfo->back().treecodes.push_back(replength); //tree symbol code repetitions
        for(size_t n = 0; n < replength; n++) { //repeat this value in the next lengths
          if(i >= HLIT + HDIST) { error = 15; return; } //error: i is larger than the amount of codes
          if(i < HLIT) bitlen[i++] = 0; else bitlenD[i++ - HLIT] = 0;
        }
      }
      else { error = 16; return; } //error: somehow an unexisting code appeared. This can never happen.
    }
    if(bitlen[256] == 0) { error = 64; return; } //the length of the end code 256 must be larger than 0
    error = tree.makeFromLengths(bitlen, 15);
    if(error) return; //now we've finally got HLIT and HDIST, so generate the code trees, and the function is done
    error = treeD.makeFromLengths(bitlenD, 15);
    if(error) return;
    zlibinfo->back().treebits = bp - bpstart;
    //lit/len/end symbol lengths
    for(size_t j = 0; j < bitlen.size(); j++) zlibinfo->back().litlenlengths.push_back(bitlen[j]);
    //dist lengths
    for(size_t j = 0; j < bitlenD.size(); j++) zlibinfo->back().distlengths.push_back(bitlenD[j]);
  }